

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_NtkProfileCones(Wlc_Ntk_t *p)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int nMults;
  int nAdders;
  int nFos;
  int nPis;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  if (0 < (p->vCos).nSize) {
    uVar3 = 0;
    do {
      iVar1 = (p->vCos).pArray[uVar3];
      if ((iVar1 < 1) || (p->nObjsAlloc <= iVar1)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      Wlc_NtkMarkCone(p,(int)uVar3,1,0,0);
      uVar2 = Wlc_NtkCountMarked(p,(int *)&local_34,(int *)&local_38,(int *)&local_3c,
                                 (int *)&local_40);
      printf("Cone %5d : ",uVar3 & 0xffffffff);
      printf("PI = %4d  ",(ulong)local_34);
      printf("FO = %4d  ",(ulong)local_38);
      printf("Node = %6d  ",(ulong)uVar2);
      printf("Add/Sub = %4d  ",(ulong)local_3c);
      printf("Mult = %4d  ",(ulong)local_40);
      putchar(10);
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)(p->vCos).nSize);
  }
  Wlc_NtkCleanMarks(p);
  return;
}

Assistant:

void Wlc_NtkProfileCones( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, nPis, nFos, nNodes, nAdders, nMults;
    Wlc_NtkForEachCo( p, pObj, i )
    {
        Wlc_NtkMarkCone( p, i, 1, 0, 0 );
        nNodes = Wlc_NtkCountMarked( p, &nPis, &nFos, &nAdders, &nMults );
        printf( "Cone %5d : ", i );
        printf( "PI = %4d  ", nPis );
        printf( "FO = %4d  ", nFos );
        printf( "Node = %6d  ", nNodes );
        printf( "Add/Sub = %4d  ", nAdders );
        printf( "Mult = %4d  ", nMults );
        printf( "\n" );
    }
    Wlc_NtkCleanMarks( p );
}